

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

_Bool uo_cb_init(void)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (!is_init) {
    is_init = true;
    _Var1 = uo_refcount_linkpool_init();
    is_init = (_Bool)(is_init & _Var1);
    uo_cb_linkpool_init();
    uo_cb_func_linkpool_init();
    _Var1 = uo_cb_thrd_init();
    is_init = (_Bool)(is_init & _Var1);
    atexit(uo_cb_quit);
    _Var1 = uo_cb_queue_init();
    is_init = (_Bool)(is_init & _Var1);
    _Var1 = uo_cb_thrdpool_init();
    is_init = (_Bool)(_Var1 & is_init);
    _Var1 = is_init;
  }
  return _Var1;
}

Assistant:

bool uo_cb_init() 
{
    if (is_init)
        return true;

    is_init = true;

    is_init &= uo_refcount_linkpool_init();
    is_init &= uo_cb_linkpool_init();
    is_init &= uo_cb_func_linkpool_init();
    is_init &= uo_cb_thrd_init();

    atexit(uo_cb_quit);

    is_init &= uo_cb_queue_init();
    is_init &= uo_cb_thrdpool_init();

    return is_init;
}